

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O0

cio_error cio_uart_get_num_data_bits(cio_uart *port,cio_uart_num_data_bits *num_data_bits)

{
  uint uVar1;
  undefined1 local_5c [4];
  cio_error err;
  termios tty;
  cio_uart_num_data_bits *num_data_bits_local;
  cio_uart *port_local;
  
  if (port == (cio_uart *)0x0) {
    port_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else {
    tty._52_8_ = num_data_bits;
    port_local._4_4_ = get_current_settings(port,(termios *)local_5c);
    if (port_local._4_4_ == CIO_SUCCESS) {
      uVar1 = tty.c_iflag & 0x30;
      if (uVar1 == 0) {
        *(undefined4 *)tty._52_8_ = 0;
      }
      else if (uVar1 == 0x10) {
        *(undefined4 *)tty._52_8_ = 1;
      }
      else if (uVar1 == 0x20) {
        *(undefined4 *)tty._52_8_ = 2;
      }
      else {
        *(undefined4 *)tty._52_8_ = 3;
      }
      port_local._4_4_ = CIO_SUCCESS;
    }
  }
  return port_local._4_4_;
}

Assistant:

enum cio_error cio_uart_get_num_data_bits(const struct cio_uart *port, enum cio_uart_num_data_bits *num_data_bits)
{
	if (cio_unlikely(port == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	struct termios tty;
	enum cio_error err = get_current_settings(port, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	switch (tty.c_cflag & (tcflag_t)CSIZE) {
	case CS5:
		*num_data_bits = CIO_UART_5_DATA_BITS;
		break;
	case CS6:
		*num_data_bits = CIO_UART_6_DATA_BITS;
		break;
	case CS7:
		*num_data_bits = CIO_UART_7_DATA_BITS;
		break;
	case CS8:
	default:
		*num_data_bits = CIO_UART_8_DATA_BITS;
		break;
	}

	return CIO_SUCCESS;
}